

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O1

sexp analyze_seq(sexp ctx,sexp ls,int depth,int defok)

{
  sexp psVar1;
  sexp res;
  sexp tmp;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp local_58;
  sexp_conflict local_50;
  sexp_gc_var_t local_48;
  sexp_gc_var_t local_38;
  
  local_48.var = &local_58;
  local_58 = (sexp)0x43e;
  local_38.next = &local_48;
  local_38.var = &local_50;
  local_50 = (sexp_conflict)0x43e;
  local_48.next = (ctx->value).context.saves;
  (ctx->value).context.saves = local_38.next;
  (ctx->value).context.saves = &local_38;
  if (ls == (sexp)&DAT_0000023e) {
    local_58 = (sexp)&DAT_0000043e;
    psVar1 = local_58;
  }
  else if ((ls->value).type.cpl == (sexp)0x23e) {
    psVar1 = analyze(ctx,(ls->value).type.name,depth,defok);
  }
  else {
    local_48.var = &local_58;
    local_58 = sexp_alloc_tagged_aux(ctx,0x18,0x21);
    (local_58->value).type.cpl = (ls->value).type.slots;
    psVar1 = analyze_list(ctx,ls,depth,defok);
    if ((((ulong)psVar1 & 3) != 0) || (psVar1->tag != 0x13)) {
      (local_58->value).type.name = psVar1;
      psVar1 = local_58;
    }
  }
  local_58 = psVar1;
  (ctx->value).context.saves = local_48.next;
  return local_58;
}

Assistant:

static sexp analyze_seq (sexp ctx, sexp ls, int depth, int defok) {
  sexp_gc_var2(res, tmp);
  sexp_gc_preserve2(ctx, res, tmp);
  if (sexp_nullp(ls))
    res = SEXP_VOID;
  else if (sexp_nullp(sexp_cdr(ls)))
    res = analyze(ctx, sexp_car(ls), depth, defok);
  else {
    res = sexp_alloc_type(ctx, seq, SEXP_SEQ);
    sexp_seq_source(res) = sexp_pair_source(ls);
    tmp = analyze_list(ctx, ls, depth, defok);
    if (sexp_exceptionp(tmp))
      res = tmp;
    else
      sexp_seq_ls(res) = tmp;
  }
  sexp_gc_release2(ctx);
  return res;
}